

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::setPlayerStrategy(Player *this,Strategies strat)

{
  PlayerStrategy *pPVar1;
  Strategies strat_local;
  Player *this_local;
  
  switch(strat) {
  case HUMAN_PLAYER:
    pPVar1 = (PlayerStrategy *)operator_new(0x40);
    HumanPlayerStrategy::HumanPlayerStrategy((HumanPlayerStrategy *)pPVar1,this);
    this->strategy = pPVar1;
    break;
  case AGGRESSIVE_BOT:
    pPVar1 = (PlayerStrategy *)operator_new(0x40);
    AggressiveBotStrategy::AggressiveBotStrategy((AggressiveBotStrategy *)pPVar1,this);
    this->strategy = pPVar1;
    break;
  case BENEVOLENT_BOT:
    pPVar1 = (PlayerStrategy *)operator_new(0x40);
    BenevolentBotStrategy::BenevolentBotStrategy((BenevolentBotStrategy *)pPVar1,this);
    this->strategy = pPVar1;
    break;
  case RANDOM_BOT:
    pPVar1 = (PlayerStrategy *)operator_new(0x40);
    RandomBotStrategy::RandomBotStrategy((RandomBotStrategy *)pPVar1,this);
    this->strategy = pPVar1;
    break;
  case CHEATER_BOT:
    pPVar1 = (PlayerStrategy *)operator_new(0x40);
    CheaterBotStrategy::CheaterBotStrategy((CheaterBotStrategy *)pPVar1,this);
    this->strategy = pPVar1;
    break;
  default:
    pPVar1 = (PlayerStrategy *)operator_new(0x40);
    HumanPlayerStrategy::HumanPlayerStrategy((HumanPlayerStrategy *)pPVar1,this);
    this->strategy = pPVar1;
  }
  return;
}

Assistant:

void Player::setPlayerStrategy(Strategies strat) {
    switch (strat) {
        case Strategies::AGGRESSIVE_BOT: {
            this->strategy = new AggressiveBotStrategy(this);
        } break;
        case Strategies::BENEVOLENT_BOT: {
            this->strategy = new BenevolentBotStrategy(this);
        } break;
        case Strategies::RANDOM_BOT: {
            this->strategy = new RandomBotStrategy(this);
        } break;
        case Strategies::HUMAN_PLAYER: {
            this->strategy = new HumanPlayerStrategy(this);
        } break;
        case Strategies::CHEATER_BOT: {
            this->strategy = new CheaterBotStrategy(this);
        } break;
        default: {
            this->strategy = new HumanPlayerStrategy(this);
        }
    }
}